

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

void Saig_CollectSatValues(sat_solver *pSat,Cnf_Dat_t *pCnf,Vec_Ptr_t *vInfo,int *piPat)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  pVVar2 = pCnf->pMan->vObjs;
  iVar7 = pVVar2->nSize;
  if (0 < iVar7) {
    ppvVar3 = pVVar2->pArray;
    lVar6 = 0;
    do {
      if ((ppvVar3[lVar6] != (void *)0x0) &&
         ((uVar4 = *(uint *)((long)ppvVar3[lVar6] + 0x18) & 7, uVar4 == 2 || (uVar4 - 5 < 2)))) {
        iVar1 = pCnf->pVarNums[lVar6];
        if ((long)iVar1 < 1) {
          __assert_fail("pCnf->pVarNums[i] > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigConstr2.c"
                        ,0x1fa,
                        "void Saig_CollectSatValues(sat_solver *, Cnf_Dat_t *, Vec_Ptr_t *, int *)")
          ;
        }
        if (vInfo->nSize <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        if (pSat->size <= iVar1) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
        }
        lVar8 = (long)(*piPat >> 5);
        uVar4 = *(uint *)((long)vInfo->pArray[lVar6] + lVar8 * 4);
        uVar5 = *piPat & 0x1f;
        if (((pSat->model[iVar1] != 1 ^ (byte)(uVar4 >> (sbyte)uVar5)) & 1) == 0) {
          *(uint *)((long)vInfo->pArray[lVar6] + lVar8 * 4) = uVar4 ^ 1 << uVar5;
          iVar7 = pVVar2->nSize;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar7);
  }
  return;
}

Assistant:

void Saig_CollectSatValues( sat_solver * pSat, Cnf_Dat_t * pCnf, Vec_Ptr_t * vInfo, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pInfo;
    int i;
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        assert( pCnf->pVarNums[i] > 0 );
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, i );
        if ( Abc_InfoHasBit(pInfo, *piPat) != sat_solver_var_value(pSat, pCnf->pVarNums[i]) )
            Abc_InfoXorBit(pInfo, *piPat);
    }
}